

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_part(REF_CELL ref_cell,REF_NODE ref_node,REF_INT cell,REF_INT *output_part)

{
  uint uVar1;
  int local_34;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell_node;
  REF_INT *output_part_local;
  REF_NODE pRStack_20;
  REF_INT cell_local;
  REF_NODE ref_node_local;
  REF_CELL ref_cell_local;
  
  *output_part = -1;
  _ref_private_macro_code_rss = output_part;
  output_part_local._4_4_ = cell;
  pRStack_20 = ref_node;
  ref_node_local = (REF_NODE)ref_cell;
  uVar1 = ref_cell_part_cell_node(ref_cell,ref_node,cell,&local_34);
  if (uVar1 == 0) {
    if (local_34 == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x395,
             "ref_cell_part","cell_node is empty?");
      ref_cell_local._4_4_ = 1;
    }
    else {
      *_ref_private_macro_code_rss =
           pRStack_20->part
           [*(int *)((long)ref_node_local->real +
                    (long)(local_34 + ref_node_local->blank * output_part_local._4_4_) * 4)];
      ref_cell_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x394,
           "ref_cell_part",(ulong)uVar1,"part_cell_node");
    ref_cell_local._4_4_ = uVar1;
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_part(REF_CELL ref_cell, REF_NODE ref_node,
                                 REF_INT cell, REF_INT *output_part) {
  REF_INT cell_node;
  *output_part = REF_EMPTY;
  RSS(ref_cell_part_cell_node(ref_cell, ref_node, cell, &cell_node),
      "part_cell_node");
  RUS(REF_EMPTY, cell_node, "cell_node is empty?");
  *output_part =
      ref_node_part(ref_node, ref_cell_c2n(ref_cell, cell_node, cell));
  return REF_SUCCESS;
}